

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void bestOrClauseIndex(WhereBestIdx *p)

{
  u16 uVar1;
  int iCursor;
  int iVar2;
  int iVar3;
  WhereClause *pWVar4;
  SrcList_item *pSVar5;
  WhereTerm *pWVar6;
  WhereClause *pWVar7;
  WhereTerm *pWVar8;
  Bitmask BVar9;
  double dVar10;
  WhereClause tempWC;
  WhereBestIdx sBOI;
  Bitmask used;
  double nRow;
  double rTotal;
  WhereTerm *pWStack_58;
  int flags;
  WhereTerm *pOrTerm;
  WhereTerm *pOrWCEnd;
  WhereClause *pOrWC;
  WhereTerm *pTerm;
  WhereTerm *pWCEnd;
  Bitmask maskSrc;
  int iCur;
  SrcList_item *pSrc;
  WhereClause *pWC;
  WhereBestIdx *p_local;
  
  pWVar4 = p->pWC;
  pSVar5 = p->pSrc;
  iCursor = pSVar5->iCursor;
  BVar9 = getMask(pWVar4->pMaskSet,iCursor);
  pWVar6 = pWVar4->a;
  iVar2 = pWVar4->nTerm;
  if ((((pSVar5->field_0x39 & 1) == 0) && (pSVar5->pIndex == (Index *)0x0)) &&
     ((pWVar4->wctrlFlags & 0x80) == 0)) {
    for (pOrWC = (WhereClause *)pWVar4->a; pOrWC < (WhereClause *)(pWVar6 + iVar2);
        pOrWC = (WhereClause *)&pOrWC->aStatic[0].iParent) {
      if ((((*(ushort *)&pOrWC->op & 0x100) != 0) &&
          (((ulong)pOrWC->aStatic[0].pExpr & (BVar9 ^ 0xffffffffffffffff) & p->notReady) == 0)) &&
         (((ulong)pOrWC->pOuter[1].pParse & BVar9) != 0)) {
        pWVar7 = pOrWC->pOuter;
        pWVar8 = pWVar7->a;
        iVar3 = pWVar7->nTerm;
        nRow = 0.0;
        used = 0;
        sBOI.cost.used = 0;
        memcpy(&tempWC.aStatic[7].prereqAll,p,0x78);
        for (pWStack_58 = pWVar7->a; pWStack_58 < pWVar8 + iVar3; pWStack_58 = pWStack_58 + 1) {
          if ((pWStack_58->eOperator & 0x200) == 0) {
            if (pWStack_58->leftCursor == iCursor) {
              tempWC.pParse = (Parse *)pWVar4->pMaskSet;
              tempWC.pOuter._0_1_ = 0x45;
              tempWC._32_8_ = pWStack_58;
              tempWC.pOuter._2_2_ = 0;
              tempWC.pOuter._4_4_ = 1;
              tempWC.pMaskSet = (WhereMaskSet *)pWVar4;
              bestIndex((WhereBestIdx *)&tempWC.aStatic[7].prereqAll);
              goto LAB_001dd6a8;
            }
          }
          else {
            bestIndex((WhereBestIdx *)&tempWC.aStatic[7].prereqAll);
LAB_001dd6a8:
            nRow = (double)sBOI.cost.plan.u + nRow;
            used = (Bitmask)((double)sBOI.cost.plan._0_8_ + (double)used);
            sBOI.cost.used = (ulong)sBOI.cost.rCost | sBOI.cost.used;
            if ((p->cost).rCost <= nRow) break;
          }
        }
        if (p->pOrderBy != (ExprList *)0x0) {
          dVar10 = estLog((double)used);
          nRow = (double)used * dVar10 + nRow;
        }
        if (nRow < (p->cost).rCost) {
          (p->cost).rCost = nRow;
          (p->cost).used = sBOI.cost.used;
          (p->cost).plan.nRow = (double)used;
          if (p->i == 0) {
            uVar1 = 0;
          }
          else {
            uVar1 = p->aLevel[p->i + -1].plan.nOBSat;
          }
          (p->cost).plan.nOBSat = uVar1;
          (p->cost).plan.wsFlags = 0x10000000;
          (p->cost).plan.u.pIdx = (Index *)pOrWC;
        }
      }
    }
  }
  return;
}

Assistant:

static void bestOrClauseIndex(WhereBestIdx *p){
#ifndef SQLITE_OMIT_OR_OPTIMIZATION
  WhereClause *pWC = p->pWC;           /* The WHERE clause */
  struct SrcList_item *pSrc = p->pSrc; /* The FROM clause term to search */
  const int iCur = pSrc->iCursor;      /* The cursor of the table  */
  const Bitmask maskSrc = getMask(pWC->pMaskSet, iCur);  /* Bitmask for pSrc */
  WhereTerm * const pWCEnd = &pWC->a[pWC->nTerm];        /* End of pWC->a[] */
  WhereTerm *pTerm;                    /* A single term of the WHERE clause */

  /* The OR-clause optimization is disallowed if the INDEXED BY or
  ** NOT INDEXED clauses are used or if the WHERE_AND_ONLY bit is set. */
  if( pSrc->notIndexed || pSrc->pIndex!=0 ){
    return;
  }
  if( pWC->wctrlFlags & WHERE_AND_ONLY ){
    return;
  }

  /* Search the WHERE clause terms for a usable WO_OR term. */
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( (pTerm->eOperator & WO_OR)!=0
     && ((pTerm->prereqAll & ~maskSrc) & p->notReady)==0
     && (pTerm->u.pOrInfo->indexable & maskSrc)!=0 
    ){
      WhereClause * const pOrWC = &pTerm->u.pOrInfo->wc;
      WhereTerm * const pOrWCEnd = &pOrWC->a[pOrWC->nTerm];
      WhereTerm *pOrTerm;
      int flags = WHERE_MULTI_OR;
      double rTotal = 0;
      double nRow = 0;
      Bitmask used = 0;
      WhereBestIdx sBOI;

      sBOI = *p;
      sBOI.pOrderBy = 0;
      sBOI.pDistinct = 0;
      sBOI.ppIdxInfo = 0;
      for(pOrTerm=pOrWC->a; pOrTerm<pOrWCEnd; pOrTerm++){
        WHERETRACE(("... Multi-index OR testing for term %d of %d....\n", 
          (pOrTerm - pOrWC->a), (pTerm - pWC->a)
        ));
        if( (pOrTerm->eOperator& WO_AND)!=0 ){
          sBOI.pWC = &pOrTerm->u.pAndInfo->wc;
          bestIndex(&sBOI);
        }else if( pOrTerm->leftCursor==iCur ){
          WhereClause tempWC;
          tempWC.pParse = pWC->pParse;
          tempWC.pMaskSet = pWC->pMaskSet;
          tempWC.pOuter = pWC;
          tempWC.op = TK_AND;
          tempWC.a = pOrTerm;
          tempWC.wctrlFlags = 0;
          tempWC.nTerm = 1;
          sBOI.pWC = &tempWC;
          bestIndex(&sBOI);
        }else{
          continue;
        }
        rTotal += sBOI.cost.rCost;
        nRow += sBOI.cost.plan.nRow;
        used |= sBOI.cost.used;
        if( rTotal>=p->cost.rCost ) break;
      }

      /* If there is an ORDER BY clause, increase the scan cost to account 
      ** for the cost of the sort. */
      if( p->pOrderBy!=0 ){
        WHERETRACE(("... sorting increases OR cost %.9g to %.9g\n",
                    rTotal, rTotal+nRow*estLog(nRow)));
        rTotal += nRow*estLog(nRow);
      }

      /* If the cost of scanning using this OR term for optimization is
      ** less than the current cost stored in pCost, replace the contents
      ** of pCost. */
      WHERETRACE(("... multi-index OR cost=%.9g nrow=%.9g\n", rTotal, nRow));
      if( rTotal<p->cost.rCost ){
        p->cost.rCost = rTotal;
        p->cost.used = used;
        p->cost.plan.nRow = nRow;
        p->cost.plan.nOBSat = p->i ? p->aLevel[p->i-1].plan.nOBSat : 0;
        p->cost.plan.wsFlags = flags;
        p->cost.plan.u.pTerm = pTerm;
      }
    }
  }
#endif /* SQLITE_OMIT_OR_OPTIMIZATION */
}